

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ColumnData::GetUpdateStatistics(ColumnData *this)

{
  int iVar1;
  long in_RSI;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x98));
  if (iVar1 == 0) {
    if (*(long *)(in_RSI + 0xc0) == 0) {
      this->_vptr_ColumnData = (_func_int **)0x0;
    }
    else {
      unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
      operator->((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>
                  *)(in_RSI + 0xc0));
      UpdateSegment::GetStatistics((UpdateSegment *)this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x98));
    return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

unique_ptr<BaseStatistics> ColumnData::GetUpdateStatistics() {
	lock_guard<mutex> update_guard(update_lock);
	return updates ? updates->GetStatistics() : nullptr;
}